

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_point.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *this;
  Point3<double> *this_00;
  bool valid;
  bool a;
  Point3f p2;
  Point3f *p1;
  Point3<double> *in_stack_ffffffffffffffd0;
  double local_28;
  double local_20;
  
  this = std::operator<<((ostream *)&std::cout,"Testing PhyRay Point3f...");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  this_00 = phyr::allocAligned<phyr::Point3<double>>(0x103381);
  phyr::Point3<double>::Point3((Point3<double> *)&stack0xffffffffffffffd0,5.0,6.0,7.0);
  this_00->x = 1.0;
  this_00->y = 2.0;
  this_00->z = 3.0;
  this_00->x = (double)in_stack_ffffffffffffffd0;
  this_00->y = local_28;
  this_00->z = local_20;
  bVar1 = phyr::Point3<double>::hasNaNs(in_stack_ffffffffffffffd0);
  std::ostream::operator<<((ostream *)&std::cout,bVar1);
  bVar1 = phyr::Point3<double>::operator==(this_00,(Point3<double> *)&stack0xffffffffffffffd0);
  phyr::freeAligned((void *)0x103440);
  return (uint)!bVar1;
}

Assistant:

int main(int argc, const char* argv[]) {
    std::cout << "Testing PhyRay Point3f..." << std::endl;

    Point3f* p1 = allocAligned<Point3f>(1);
    Point3f p2(5, 6, 7);
    p1->x = 1; p1->y = 2; p1->z = 3;

    *p1 = p2;

    ASSERT(!p1->hasNaNs());

    bool a = p1->hasNaNs();
    std::cout << a;

    bool valid = *p1 == p2;

    freeAligned(p1);

    return valid ? 0 : 1;
}